

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsValidation.cpp
# Opt level: O1

bool __thiscall
chrono::utils::ChValidation::Process(ChValidation *this,string *sim_filename,char delim)

{
  ulong uVar1;
  double dVar2;
  size_t sVar3;
  pointer pvVar4;
  ulong uVar5;
  size_t sVar6;
  double *pdVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  sVar6 = ReadDataFile(sim_filename,delim,&this->m_sim_headers,&this->m_sim_data);
  this->m_num_rows = sVar6;
  lVar9 = (long)(this->m_sim_headers).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_sim_headers).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  sVar6 = lVar9 >> 5;
  this->m_num_cols = sVar6;
  sVar6 = sVar6 - 1;
  if ((this->m_L2_norms)._M_size != sVar6) {
    operator_delete((this->m_L2_norms)._M_data);
    (this->m_L2_norms)._M_size = sVar6;
    sim_filename = (string *)(sVar6 * 8);
    pdVar7 = (double *)::operator_new((ulong)sim_filename);
    (this->m_L2_norms)._M_data = pdVar7;
  }
  if (sVar6 != 0) {
    sim_filename = (string *)(this->m_L2_norms)._M_data;
    memset(sim_filename,0,(lVar9 >> 2 & 0xfffffffffffffff8U) - 8);
  }
  sVar3 = this->m_num_cols;
  sVar6 = sVar3 - 1;
  if ((this->m_RMS_norms)._M_size != sVar6) {
    operator_delete((this->m_RMS_norms)._M_data);
    (this->m_RMS_norms)._M_size = sVar6;
    sim_filename = (string *)(sVar6 * 8);
    pdVar7 = (double *)::operator_new((ulong)sim_filename);
    (this->m_RMS_norms)._M_data = pdVar7;
  }
  if (sVar6 != 0) {
    sim_filename = (string *)(this->m_RMS_norms)._M_data;
    memset(sim_filename,0,sVar3 * 8 - 8);
  }
  sVar3 = this->m_num_cols;
  sVar6 = sVar3 - 1;
  if ((this->m_INF_norms)._M_size != sVar6) {
    operator_delete((this->m_INF_norms)._M_data);
    (this->m_INF_norms)._M_size = sVar6;
    sim_filename = (string *)(sVar6 * 8);
    pdVar7 = (double *)::operator_new((ulong)sim_filename);
    (this->m_INF_norms)._M_data = pdVar7;
  }
  if (sVar6 != 0) {
    sim_filename = (string *)(this->m_INF_norms)._M_data;
    memset(sim_filename,0,sVar3 * 8 - 8);
  }
  if (this->m_num_cols != 1) {
    uVar10 = 0;
    do {
      uVar1 = uVar10 + 1;
      pvVar4 = (this->m_sim_data).
               super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      sVar6 = pvVar4[uVar1]._M_size;
      auVar12 = ZEXT816(0) << 0x40;
      if (sVar6 != 0) {
        pdVar7 = pvVar4[uVar1]._M_data;
        dVar11 = pdVar7[sVar6 - 1];
        dVar11 = dVar11 * dVar11;
        for (; auVar12._8_8_ = 0, auVar12._0_8_ = dVar11, sVar6 != 1; sVar6 = sVar6 - 1) {
          dVar2 = pdVar7[sVar6 - 2];
          dVar11 = dVar11 + dVar2 * dVar2;
        }
      }
      if (auVar12._0_8_ < 0.0) {
        dVar11 = sqrt(auVar12._0_8_);
      }
      else {
        auVar12 = vsqrtsd_avx(auVar12,auVar12);
        dVar11 = auVar12._0_8_;
      }
      (this->m_L2_norms)._M_data[uVar10] = dVar11;
      dVar11 = RMSnorm((ChValidation *)sim_filename,
                       (this->m_sim_data).
                       super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar1);
      (this->m_RMS_norms)._M_data[uVar10] = dVar11;
      pvVar4 = (this->m_sim_data).
               super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar5 = pvVar4[uVar1]._M_size;
      if (uVar5 == 0) {
        auVar12 = ZEXT816(0);
      }
      else {
        auVar13._8_8_ = 0;
        auVar13._0_8_ = *pvVar4[uVar1]._M_data;
        auVar15._8_8_ = 0x7fffffffffffffff;
        auVar15._0_8_ = 0x7fffffffffffffff;
        auVar12 = vandpd_avx(auVar13,auVar15);
      }
      auVar16._8_8_ = 0x7fffffffffffffff;
      auVar16._0_8_ = 0x7fffffffffffffff;
      dVar11 = auVar12._0_8_;
      if (1 < uVar5) {
        uVar8 = 1;
        do {
          auVar14._8_8_ = 0;
          auVar14._0_8_ = pvVar4[uVar1]._M_data[uVar8];
          auVar13 = vandpd_avx(auVar14,auVar16);
          auVar12 = vmaxsd_avx(auVar13,auVar12);
          dVar11 = auVar12._0_8_;
          uVar8 = uVar8 + 1;
        } while (uVar5 != uVar8);
      }
      (this->m_INF_norms)._M_data[uVar10] = dVar11;
      uVar10 = uVar1;
    } while (uVar1 < this->m_num_cols - 1);
  }
  return true;
}

Assistant:

bool ChValidation::Process(const std::string& sim_filename,
                           char               delim)
{
  // Read the simulation results file.
  m_num_rows = ReadDataFile(sim_filename, delim, m_sim_headers, m_sim_data);
  m_num_cols = m_sim_headers.size();

  // Resize arrays of norms.
  m_L2_norms.resize(m_num_cols - 1);
  m_RMS_norms.resize(m_num_cols - 1);
  m_INF_norms.resize(m_num_cols - 1);

  // Calculate norms of the column vectors.
  for (size_t col = 0; col < m_num_cols - 1; col++) {
    m_L2_norms[col] = L2norm(m_sim_data[col + 1]);
    m_RMS_norms[col] = RMSnorm(m_sim_data[col + 1]);
    m_INF_norms[col] = INFnorm(m_sim_data[col + 1]);
  }

  return true;
}